

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

void google::protobuf::internal::TcParser::DestroyMapNode
               (NodeBase *node,MapAuxInfo map_info,UntypedMapBase *map)

{
  uint uVar1;
  
  if ((map_info._0_4_ & 0x38) == 0x18) {
    std::__cxx11::string::~string((string *)(node + 1));
  }
  uVar1 = map_info._0_4_ >> 0xb & 7;
  if (uVar1 == 4) {
    MessageLite::DestroyInstance
              ((MessageLite *)((long)&node->next + ((ulong)map_info >> 0x20 & 0xffff)));
  }
  else if (uVar1 == 3) {
    std::__cxx11::string::~string
              ((string *)((long)&node->next + ((ulong)map_info >> 0x20 & 0xffff)));
  }
  UntypedMapBase::DeallocNode(map,node,map_info.node_size_info);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TcParser::DestroyMapNode(NodeBase* node,
                                                MapAuxInfo map_info,
                                                UntypedMapBase& map) {
  if (map_info.key_type_card.cpp_type() == MapTypeCard::kString) {
    static_cast<std::string*>(node->GetVoidKey())->~basic_string();
  }
  if (map_info.value_type_card.cpp_type() == MapTypeCard::kString) {
    static_cast<std::string*>(node->GetVoidValue(map_info.node_size_info))
        ->~basic_string();
  } else if (map_info.value_type_card.cpp_type() == MapTypeCard::kMessage) {
    static_cast<MessageLite*>(node->GetVoidValue(map_info.node_size_info))
        ->DestroyInstance();
  }
  map.DeallocNode(node, map_info.node_size_info);
}